

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactions.cc
# Opt level: O0

void INTERACTIONS::eval_count_of_generated_ft
               (vw *all,example *ec,size_t *new_features_cnt,float *new_features_value)

{
  float fVar1;
  float fVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  byte *pbVar6;
  size_t sVar7;
  reference pcVar8;
  long lVar9;
  v_array<float> *pvVar10;
  float *pfVar11;
  int64_t iVar12;
  float *in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t num;
  size_t l;
  size_t n;
  size_t ft_size;
  size_t i_2;
  float x;
  size_t i_1;
  size_t i;
  size_t cnt_ft_value_non_1;
  features *fs;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ns_end;
  size_t order_of_inter;
  int nsc;
  iterator ns_1;
  float sum_feat_sq_in_inter_1;
  size_t num_features_in_inter_1;
  string *inter_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  namespace_index ns;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  float sum_feat_sq_in_inter;
  size_t num_features_in_inter;
  string *inter;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  v_array<float> results;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe58;
  v_array<float> *in_stack_fffffffffffffe60;
  float in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe6c;
  long local_160;
  ulong local_158;
  long local_150;
  size_t local_140;
  ulong local_130;
  ulong local_120;
  long local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  ulong local_f8;
  int local_ec;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  undefined8 local_e0;
  char *local_d8;
  undefined8 local_d0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  float local_bc;
  long local_b8;
  reference local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  long local_98;
  byte local_89;
  undefined8 local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  reference local_78;
  float local_6c;
  long local_68;
  reference local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  long local_48;
  v_array<float> local_40;
  float *local_20;
  long *local_18;
  long local_10;
  long local_8;
  
  *in_RDX = 0;
  *in_RCX = 0.0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  v_init<float>();
  if ((*(byte *)(local_8 + 0x360) & 1) == 0) {
    local_98 = local_8 + 0x368;
    local_a0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffe58);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(in_stack_fffffffffffffe58);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffe60,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffe58), bVar4) {
      local_b0 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_a0);
      local_b8 = 1;
      local_bc = 1.0;
      local_c8._M_current = (char *)std::__cxx11::string::begin();
      while( true ) {
        local_d0 = std::__cxx11::string::end();
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffe60,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffe58);
        if (!bVar4) break;
        local_e0 = std::__cxx11::string::end();
        local_d8 = (char *)__gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)CONCAT44(in_stack_fffffffffffffe6c,
                                                   in_stack_fffffffffffffe68),
                                       (difference_type)in_stack_fffffffffffffe60);
        bVar5 = __gnu_cxx::operator==
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffe60,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffe58);
        bVar4 = true;
        if (!bVar5) {
          pcVar8 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_c8);
          cVar3 = *pcVar8;
          local_e8 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                 (difference_type)in_stack_fffffffffffffe60);
          pcVar8 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_e8);
          bVar4 = cVar3 != *pcVar8;
        }
        if (bVar4) {
          pcVar8 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_c8);
          local_ec = (int)*pcVar8;
          sVar7 = features::size((features *)0x2f36d7);
          local_b8 = sVar7 * local_b8;
          local_bc = *(float *)(local_10 + (long)local_ec * 0x68 + 0x80) * local_bc;
          if (local_b8 == 0) break;
        }
        else {
          local_f8 = 2;
          local_100 = __gnu_cxx::
                      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                  (difference_type)in_stack_fffffffffffffe60);
          while( true ) {
            std::__cxx11::string::end();
            bVar4 = __gnu_cxx::operator<
                              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffe60,
                               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffe58);
            if (!bVar4) break;
            pcVar8 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_c8);
            cVar3 = *pcVar8;
            pcVar8 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_100);
            if (cVar3 == *pcVar8) {
              local_f8 = local_f8 + 1;
            }
            __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&local_100);
          }
          lVar9 = local_10 + 0x20;
          pcVar8 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_c8);
          pvVar10 = (v_array<float> *)(lVar9 + (long)(int)*pcVar8 * 0x68);
          local_118 = 0;
          for (local_120 = 0; sVar7 = v_array<float>::size(&local_40), local_120 < sVar7;
              local_120 = local_120 + 1) {
            pfVar11 = v_array<float>::operator[](&local_40,local_120);
            *pfVar11 = 0.0;
          }
          while (sVar7 = v_array<float>::size(&local_40), sVar7 < local_f8) {
            v_array<float>::push_back(in_stack_fffffffffffffe60,(float *)in_stack_fffffffffffffe58);
          }
          for (local_130 = 0; sVar7 = features::size((features *)0x2f38e4), local_130 < sVar7;
              local_130 = local_130 + 1) {
            pfVar11 = v_array<float>::operator[](pvVar10,local_130);
            fVar1 = *pfVar11;
            pfVar11 = v_array<float>::operator[](pvVar10,local_130);
            fVar2 = *pfVar11;
            pfVar11 = v_array<float>::operator[](&local_40,0);
            *pfVar11 = fVar1 * fVar2 + *pfVar11;
            for (local_140 = 1; local_140 < local_f8; local_140 = local_140 + 1) {
              pfVar11 = v_array<float>::operator[](&local_40,local_140 - 1);
              in_stack_fffffffffffffe68 = *pfVar11;
              in_stack_fffffffffffffe6c = fVar1 * fVar2;
              pfVar11 = v_array<float>::operator[](&local_40,local_140);
              *pfVar11 = in_stack_fffffffffffffe68 * in_stack_fffffffffffffe6c + *pfVar11;
            }
            local_118 = local_118 + 1;
          }
          pfVar11 = v_array<float>::operator[](&local_40,local_f8 - 1);
          local_bc = *pfVar11 * local_bc;
          sVar7 = features::size((features *)0x2f3a43);
          if ((local_118 == 0) && (sVar7 < local_f8)) {
            local_b8 = 0;
            break;
          }
          if (local_118 == 0) {
            local_150 = choose(sVar7,local_f8);
          }
          else {
            local_150 = 0;
            for (local_158 = 0; local_158 <= local_f8; local_158 = local_158 + 1) {
              if (local_158 == 0) {
                in_stack_fffffffffffffe60 = (v_array<float> *)0x1;
              }
              else {
                in_stack_fffffffffffffe60 =
                     (v_array<float> *)choose(local_158 + local_118 + -1,local_158);
              }
              if (sVar7 - local_118 < local_f8 - local_158) {
                local_160 = 0;
              }
              else {
                pvVar10 = in_stack_fffffffffffffe60;
                iVar12 = choose(sVar7 - local_118,local_f8 - local_158);
                local_160 = iVar12 * (long)in_stack_fffffffffffffe60;
                in_stack_fffffffffffffe60 = pvVar10;
              }
              local_150 = local_160 + local_150;
            }
          }
          local_b8 = local_150 * local_b8;
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator+=(&local_c8,local_f8 - 1);
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_c8);
      }
      if (local_b8 != 0) {
        *local_18 = local_b8 + *local_18;
        *local_20 = local_bc + *local_20;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_a0);
    }
  }
  else {
    local_48 = local_8 + 0x368;
    local_50._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffe58);
    local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(in_stack_fffffffffffffe58);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffe60,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffe58), bVar4) {
      local_78 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_50);
      local_68 = 1;
      local_6c = 1.0;
      local_60 = local_78;
      local_80._M_current = (char *)std::__cxx11::string::begin();
      local_88 = std::__cxx11::string::end();
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffe60,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffe58), bVar4) {
        pbVar6 = (byte *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_80);
        local_89 = *pbVar6;
        sVar7 = features::size((features *)0x2f3465);
        local_68 = sVar7 * local_68;
        local_6c = *(float *)(local_10 + (ulong)local_89 * 0x68 + 0x80) * local_6c;
        if (local_68 == 0) break;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_80);
      }
      if (local_68 != 0) {
        *local_18 = local_68 + *local_18;
        *local_20 = local_6c + *local_20;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_50);
    }
  }
  v_array<float>::delete_v(in_stack_fffffffffffffe60);
  return;
}

Assistant:

void eval_count_of_generated_ft(vw& all, example& ec, size_t& new_features_cnt, float& new_features_value)
{
  new_features_cnt = 0;
  new_features_value = 0.;

  v_array<float> results = v_init<float>();

  if (all.permutations)
  {
    // just multiply precomputed values for all namespaces
    for (std::string& inter : all.interactions)
    {
      size_t num_features_in_inter = 1;
      float sum_feat_sq_in_inter = 1.;

      for (namespace_index ns : inter)
      {
        num_features_in_inter *= ec.feature_space[ns].size();
        sum_feat_sq_in_inter *= ec.feature_space[ns].sum_feat_sq;
        if (num_features_in_inter == 0)
          break;
      }

      if (num_features_in_inter == 0)
        continue;

      new_features_cnt += num_features_in_inter;
      new_features_value += sum_feat_sq_in_inter;
    }
  }
  else  // case of simple combinations
  {
#ifdef DEBUG_EVAL_COUNT_OF_GEN_FT
    size_t correct_features_cnt = 0;
    float correct_features_value = 0.;
    eval_gen_data dat(correct_features_cnt, correct_features_value);
    generate_interactions<eval_gen_data, uint64_t, ft_cnt>(all, ec, dat);
#endif

    for (std::string& inter : all.interactions)
    {
      size_t num_features_in_inter = 1;
      float sum_feat_sq_in_inter = 1.;

      for (auto ns = inter.begin(); ns != inter.end(); ++ns)
      {
        if ((ns == inter.end() - 1) || (*ns != *(ns + 1)))  // neighbour namespaces are different
        {
          // just multiply precomputed values
          const int nsc = *ns;
          num_features_in_inter *= ec.feature_space[nsc].size();
          sum_feat_sq_in_inter *= ec.feature_space[nsc].sum_feat_sq;
          if (num_features_in_inter == 0)
            break;  // one of namespaces has no features - go to next interaction
        }
        else  // we are at beginning of a block made of same namespace (interaction is preliminary sorted)
        {
          // let's find out real length of this block
          size_t order_of_inter = 2;  // alredy compared ns == ns+1

          for (auto ns_end = ns + 2; ns_end < inter.end(); ++ns_end)
            if (*ns == *ns_end)
              ++order_of_inter;

          // namespace is same for whole block
          features& fs = ec.feature_space[(const int)*ns];

          // count number of features with value != 1.;
          size_t cnt_ft_value_non_1 = 0;

          // in this block we shall calculate number of generated features and sum of their values
          // keeping in mind rules applicable for simple combinations instead of permutations

          // let's calculate sum of their squared value for whole block

          // ensure results as big as order_of_inter and empty.
          for (size_t i = 0; i < results.size(); ++i) results[i] = 0.;
          while (results.size() < order_of_inter) results.push_back(0.);

          // recurrent value calculations
          for (size_t i = 0; i < fs.size(); ++i)
          {
            const float x = fs.values[i] * fs.values[i];

            if (!PROCESS_SELF_INTERACTIONS(fs.values[i]))
            {
              for (size_t i = order_of_inter - 1; i > 0; --i) results[i] += results[i - 1] * x;

              results[0] += x;
            }
            else
            {
              results[0] += x;

              for (size_t i = 1; i < order_of_inter; ++i) results[i] += results[i - 1] * x;

              ++cnt_ft_value_non_1;
            }
          }

          sum_feat_sq_in_inter *= results[order_of_inter - 1];  // will be explained in http://bit.ly/1Hk9JX1

          // let's calculate  the number of a new features

          // if number of features is less than  order of interaction then go to the next interaction
          // as you can't make simple combination of interaction 'aaa' if a contains < 3 features.
          // unless one of them has value != 1. and we are counting them.
          const size_t ft_size = fs.size();
          if (cnt_ft_value_non_1 == 0 && ft_size < order_of_inter)
          {
            num_features_in_inter = 0;
            break;
          }

          size_t n;
          if (cnt_ft_value_non_1 == 0)  // number of generated simple combinations is C(n,k)
          {
            n = (size_t)choose((int64_t)ft_size, (int64_t)order_of_inter);
          }
          else
          {
            n = 0;
            for (size_t l = 0; l <= order_of_inter; ++l)
            {
              // C(l+m-1, l) * C(n-m, k-l)
              size_t num = (l == 0) ? 1 : (size_t)choose(l + cnt_ft_value_non_1 - 1, l);

              if (ft_size - cnt_ft_value_non_1 >= order_of_inter - l)
                num *= (size_t)choose(ft_size - cnt_ft_value_non_1, order_of_inter - l);
              else
                num = 0;

              n += num;
            }

          }  // details on http://bit.ly/1Hk9JX1

          num_features_in_inter *= n;

          ns += order_of_inter - 1;  // jump over whole block
        }
      }

      if (num_features_in_inter == 0)
        continue;  // signal that values should be ignored (as default value is 1)

      new_features_cnt += num_features_in_inter;
      new_features_value += sum_feat_sq_in_inter;
    }

#ifdef DEBUG_EVAL_COUNT_OF_GEN_FT
    if (correct_features_cnt != new_features_cnt)
      all.trace_message << "Incorrect new features count " << new_features_cnt << " must be " << correct_features_cnt
                        << endl;
    if (fabs(correct_features_value - new_features_value) > 1e-5)
      all.trace_message << "Incorrect new features value " << new_features_value << " must be "
                        << correct_features_value << endl;
#endif
  }

  results.delete_v();
}